

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O3

void verifyTinySVD_3x3<double>(Matrix33<double> *A)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int i;
  long lVar5;
  double *pdVar6;
  double (*padVar7) [3];
  int j;
  long lVar8;
  Matrix33 *pMVar9;
  int j_1;
  bool bVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  Vec3<double> S;
  Matrix33<double> S_times_Vt;
  Matrix33<double> V;
  Matrix33<double> U;
  Matrix33<double> tmp;
  double local_198 [12];
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  double local_118;
  double local_110;
  double dStack_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  double local_38;
  
  dVar12 = 0.0;
  lVar5 = 0;
  padVar7 = (double (*) [3])A;
  do {
    lVar8 = 0;
    dVar13 = dVar12;
    do {
      dVar12 = ABS((*(double (*) [3])*padVar7)[lVar8]);
      if (dVar12 <= dVar13) {
        dVar12 = dVar13;
      }
      lVar8 = lVar8 + 1;
      dVar13 = dVar12;
    } while (lVar8 != 3);
    lVar5 = lVar5 + 1;
    padVar7 = padVar7 + 1;
  } while (lVar5 != 3);
  local_98 = dVar12 * 10.0 * 2.220446049250313e-16;
  uStack_90 = 0;
  bVar10 = true;
  while( true ) {
    local_f0 = 1.0;
    local_d8 = 0.0;
    local_e8 = 0.0;
    dStack_e0 = 0.0;
    local_d0 = 1.0;
    local_b8 = 0.0;
    local_c8 = 0.0;
    dStack_c0 = 0.0;
    local_b0 = 1.0;
    local_138 = 1.0;
    local_120 = 0.0;
    local_130 = 0.0;
    dStack_128 = 0.0;
    local_118 = 1.0;
    local_100 = 0.0;
    local_110 = 0.0;
    dStack_108 = 0.0;
    local_f8 = 1.0;
    Imath_3_2::jacobiSVD<double>
              ((Matrix33 *)A,(Matrix33 *)&local_f0,(Vec3 *)local_198,(Matrix33 *)&local_138,
               2.220446049250313e-16,bVar10);
    local_198[3] = 1.0;
    local_198[6] = 0.0;
    local_198[4] = 0.0;
    local_198[5] = 0.0;
    local_198[7] = 1.0;
    local_198[10] = 0.0;
    local_198[8] = 0.0;
    local_198[9] = 0.0;
    local_198[0xb] = 1.0;
    pdVar6 = local_198;
    lVar5 = 0;
    pMVar9 = (Matrix33 *)&local_138;
    do {
      pdVar6 = pdVar6 + 3;
      lVar8 = 0;
      do {
        pdVar6[lVar8] = local_198[lVar8] * *(double *)(pMVar9 + lVar8 * 8);
        dVar4 = local_198[10];
        dVar3 = local_198[9];
        dVar2 = local_198[8];
        dVar1 = local_198[6];
        dVar13 = local_198[5];
        dVar12 = local_198[4];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar5 = lVar5 + 1;
      pMVar9 = pMVar9 + 0x18;
    } while (lVar5 != 3);
    local_198[4] = local_198[6];
    local_198[5] = local_198[9];
    local_198[6] = dVar12;
    local_198[8] = local_198[10];
    local_198[9] = dVar13;
    local_198[10] = dVar2;
    local_a8 = local_f0;
    uStack_a0 = 0;
    local_78 = dStack_e0 * dVar13 + local_f0 * local_198[3] + local_e8 * dVar12;
    dStack_70 = dStack_e0 * dVar2 + local_f0 * dVar1 + local_e8 * local_198[7];
    local_88 = local_e8;
    uStack_80 = 0;
    local_68 = local_198[0xb] * dStack_e0 + dVar3 * local_f0 + local_e8 * dVar4;
    dStack_60 = dVar13 * local_c8 + local_198[3] * local_d8 + local_d0 * dVar12;
    local_58 = dVar2 * local_c8 + dVar1 * local_d8 + local_d0 * local_198[7];
    dStack_50 = local_198[0xb] * local_c8 + dVar3 * local_d8 + local_d0 * dVar4;
    dVar1 = local_b0 * dVar2 + dStack_c0 * dVar1 + local_b8 * local_198[7];
    local_48._8_4_ = SUB84(dVar1,0);
    local_48._0_8_ = local_b0 * dVar13 + dStack_c0 * local_198[3] + local_b8 * dVar12;
    local_48._12_4_ = (int)((ulong)dVar1 >> 0x20);
    local_38 = local_198[0xb] * local_b0 + dVar3 * dStack_c0 + dVar4 * local_b8;
    pdVar6 = &local_78;
    lVar5 = 0;
    padVar7 = (double (*) [3])A;
    do {
      lVar8 = 0;
      do {
        if (local_98 < ABS(pdVar6[lVar8] - (*(double (*) [3])*padVar7)[lVar8])) {
          __assert_fail("std::abs (product[i][j] - A[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x55,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]")
          ;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar5 = lVar5 + 1;
      padVar7 = padVar7 + 1;
      pdVar6 = pdVar6 + 3;
    } while (lVar5 != 3);
    if (bVar10 != false) {
      if (dStack_e0 * (local_d8 * local_b8 - dStack_c0 * local_d0) +
          local_f0 * (local_d0 * local_b0 - local_b8 * local_c8) +
          local_e8 * (local_c8 * dStack_c0 - local_b0 * local_d8) <= 0.9) {
        __assert_fail("U.determinant () > 0.9",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x5a,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
      if ((local_120 * local_100 - dStack_108 * local_118) * dStack_128 +
          (local_118 * local_f8 - local_100 * local_110) * local_138 +
          (local_110 * dStack_108 - local_f8 * local_120) * local_130 <= 0.9) {
        __assert_fail("V.determinant () > 0.9",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x5b,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
    }
    lVar5 = 1;
    while (lVar5 != 3) {
      lVar8 = lVar5 + -1;
      pdVar6 = local_198 + lVar5;
      lVar5 = lVar5 + 1;
      if (local_198[lVar8] < *pdVar6) {
        __assert_fail("S[i] >= S[i + 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x60,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
      }
    }
    if ((local_198[0] < 0.0) || (local_198[1] < 0.0)) break;
    if (local_198[2] < 0.0 && bVar10 == false) {
      __assert_fail("S[2] >= T (0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                    ,0x66,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
    }
    verifyOrthonormal<double>((Matrix33<double> *)&local_f0);
    verifyOrthonormal<double>((Matrix33<double> *)&local_138);
    bVar11 = bVar10 == false;
    bVar10 = false;
    if (bVar11) {
      return;
    }
  }
  __assert_fail("S[i] >= T (0)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                ,100,"void verifyTinySVD_3x3(const Imath_3_2::Matrix33<T> &) [T = double]");
}

Assistant:

void
verifyTinySVD_3x3 (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    T maxEntry = 0;
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            maxEntry = std::max (maxEntry, std::abs (A[i][j]));

    const T eps      = std::numeric_limits<T>::epsilon ();
    const T valueEps = maxEntry * T (10) * eps;

    for (int i = 0; i < 2; ++i)
    {
        const bool posDet = (i == 0);

        IMATH_INTERNAL_NAMESPACE::Matrix33<T> U, V;
        IMATH_INTERNAL_NAMESPACE::Vec3<T>     S;
        IMATH_INTERNAL_NAMESPACE::jacobiSVD (A, U, S, V, eps, posDet);

        IMATH_INTERNAL_NAMESPACE::Matrix33<T> S_times_Vt;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                S_times_Vt[i][j] = S[j] * V[i][j];
        S_times_Vt.transpose ();

        // Verify that the product of the matrices is A:
        const IMATH_INTERNAL_NAMESPACE::Matrix33<T> product = U * S_times_Vt;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                assert (std::abs (product[i][j] - A[i][j]) <= valueEps);

        // Verify that U and V are orthogonal:
        if (posDet)
        {
            assert (U.determinant () > 0.9);
            assert (V.determinant () > 0.9);
        }

        // Verify that the singular values are sorted:
        for (int i = 0; i < 2; ++i)
            assert (S[i] >= S[i + 1]);

        // Verify that all the SVs except maybe the last one are positive:
        for (int i = 0; i < 2; ++i)
            assert (S[i] >= T (0));

        if (!posDet) assert (S[2] >= T (0));

        verifyOrthonormal (U);
        verifyOrthonormal (V);
    }
}